

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O0

void __thiscall
Hand::Hand(Hand *this,vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *contour,
          bool shouldCheckSize,bool shouldCheckAngles,bool shouldGetLast,int maxAngle,
          bool shouldCheckDists)

{
  _InputArray local_138;
  undefined1 local_120 [40];
  _InputArray local_f8 [8];
  byte local_21;
  int local_20;
  byte local_1b;
  byte local_1a;
  bool shouldCheckDists_local;
  int maxAngle_local;
  bool shouldGetLast_local;
  bool shouldCheckAngles_local;
  bool shouldCheckSize_local;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *contour_local;
  Hand *this_local;
  
  local_21 = shouldCheckDists;
  local_20 = maxAngle;
  local_1b = shouldGetLast;
  local_1a = shouldCheckAngles;
  shouldCheckDists_local = shouldCheckSize;
  _maxAngle_local = contour;
  contour_local = &this->contour;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->contour,contour);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->hull);
  std::vector<int,_std::allocator<int>_>::vector(&this->hullI);
  std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::vector(&this->defects);
  cv::Rect_<int>::Rect_(&this->border);
  std::vector<Finger,_std::allocator<Finger>_>::vector(&this->fingers);
  cv::Moments::Moments(&this->moment);
  cv::Point_<int>::Point_(&this->center,-1,-1);
  cv::Size_<int>::Size_(&this->areaLimits,0x9c4,640000);
  this->maxFingers = 5;
  this->maxAspectRatio = 4;
  this->maxAngle = local_20;
  this->minFTDist = 10;
  Finger::Finger(&this->higherFinger);
  Finger::Finger(&this->farthestFinger);
  this->ok = false;
  this->shouldCheckSize = (bool)(shouldCheckDists_local & 1);
  this->shouldCheckAngles = (bool)(local_1a & 1);
  this->shouldCheckDists = (bool)(local_21 & 1);
  this->shouldGetLast = (bool)(local_1b & 1);
  this->filtersIndex = -1;
  cv::_InputArray::_InputArray<cv::Point_<int>>((_InputArray *)(local_120 + 0x10),contour);
  cv::moments(local_f8,(bool)((char)local_120 + '\x10'));
  memcpy(&this->moment,local_f8,0xc0);
  cv::_InputArray::~_InputArray((_InputArray *)(local_120 + 0x10));
  this->area = *(double *)&this->moment;
  cv::_InputArray::_InputArray<cv::Point_<int>>(&local_138,contour);
  cv::boundingRect((_InputArray *)local_120);
  cv::Rect_<int>::operator=(&this->border,(Rect_<int> *)local_120);
  cv::_InputArray::~_InputArray(&local_138);
  return;
}

Assistant:

Hand::Hand(vector<Point> contour, bool shouldCheckSize, bool shouldCheckAngles,
           bool shouldGetLast, int maxAngle, bool shouldCheckDists)
        : contour(contour), shouldCheckSize(shouldCheckSize), shouldCheckAngles(shouldCheckAngles),
          shouldGetLast(shouldGetLast), maxAngle(maxAngle), shouldCheckDists(shouldCheckDists) {
    moment = moments(contour);
    area = moment.m00;
    border = boundingRect(contour);
}